

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void __thiscall
fmt::v10::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  uint uVar1;
  bool bVar2;
  int i;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  ushort uVar6;
  char *pcVar7;
  char *pcVar8;
  basic_string_view<char> lhs;
  basic_string_view<char> rhs;
  long lStack_30;
  
  if (((ulong)text_color & 1) == 0) {
    sVar5 = strlen(esc);
    lhs.size_ = sVar5;
    lhs.data_ = esc;
    rhs.size_ = 7;
    rhs.data_ = "\x1b[48;2;";
    bVar2 = operator==(lhs,rhs);
    uVar1 = text_color.value.rgb_color & 0xff;
    uVar3 = uVar1 + 10;
    if (!bVar2) {
      uVar3 = uVar1;
    }
    uVar6 = (ushort)uVar3;
    this->buffer[0] = '\x1b';
    this->buffer[1] = '[';
    if (uVar3 < 100) {
      lStack_30 = 2;
    }
    else {
      this->buffer[2] = '1';
      uVar6 = uVar6 % 100;
      lStack_30 = 3;
    }
    pcVar7 = this->buffer + lStack_30;
    pcVar8 = pcVar7 + 3;
    *pcVar7 = (byte)((uVar6 & 0xff) / 10) | 0x30;
    pcVar7[1] = (byte)((uVar6 & 0xff) % 10) | 0x30;
    pcVar7[2] = 0x6d;
  }
  else {
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      this->buffer[lVar4] = esc[lVar4];
    }
    to_esc(text_color.value._2_1_,this->buffer + 7,';');
    to_esc(text_color.value._1_1_,this->buffer + 0xb,';');
    to_esc(text_color.value._0_1_,this->buffer + 0xf,'m');
    pcVar8 = this->buffer + 0x13;
  }
  *pcVar8 = 0;
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(detail::color_type text_color,
                                  const char* esc) noexcept {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == string_view("\x1b[48;2;");
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }